

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O1

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestExtends::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  undefined6 in_register_00000012;
  DispatchCallResult DVar2;
  undefined8 uVar1;
  
  if (CONCAT62(in_register_00000012,methodId) == -0x7714ed5f1f506d4e) {
    DVar2 = TestInterface::Server::dispatchCallInternal
                      ((Server *)this,
                       (uint16_t)interfaceId + (short)*(undefined8 *)(*(long *)interfaceId + -0x60),
                       (CallContextHook *)((ulong)context.hook & 0xffff));
    uVar1 = DVar2._8_8_;
  }
  else if (CONCAT62(in_register_00000012,methodId) == -0x1b164536798f48b8) {
    DVar2 = dispatchCallInternal
                      (this,(uint16_t)interfaceId,(CallContextHook *)((ulong)context.hook & 0xffff))
    ;
    uVar1 = DVar2._8_8_;
  }
  else {
    DVar2 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)(interfaceId + *(long *)(*(long *)interfaceId + -0x18)),0x2ee573);
    uVar1 = DVar2._8_8_;
  }
  DVar2.isStreaming = (bool)(char)uVar1;
  DVar2.allowCancellation = (bool)(char)((ulong)uVar1 >> 8);
  DVar2._10_6_ = (int6)((ulong)uVar1 >> 0x10);
  DVar2.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar2;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestExtends::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (interfaceId) {
    case 0xe4e9bac98670b748ull:
      return dispatchCallInternal(methodId, context);
    case 0x88eb12a0e0af92b2ull:
      return  ::capnproto_test::capnp::test::TestInterface::Server::dispatchCallInternal(methodId, context);
    default:
      return internalUnimplemented("capnp/test.capnp:TestExtends", interfaceId);
  }
}